

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase61::run(TestCase61 *this)

{
  bool bVar1;
  Nested *pNVar2;
  Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t> *other;
  byte local_9a;
  byte local_71;
  bool local_61;
  DebugExpression<bool_&> DStack_60;
  bool _kj_shouldLog_3;
  bool local_55;
  bool local_54;
  bool local_53;
  DebugExpression<bool> local_52;
  bool local_51;
  bool _kjCondition_3;
  bool _kj_shouldLog_2;
  DebugExpression<bool> _kjCondition_2;
  DebugExpression<bool_&> DStack_50;
  bool _kj_shouldLog_1;
  DebugExpression<bool_&> _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t> local_38;
  undefined1 local_28 [8];
  Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t> nested;
  bool destroyed2;
  bool destroyed1;
  TestCase61 *this_local;
  
  nested.ptr._7_1_ = 0;
  nested.ptr._6_1_ = 0;
  heap<kj::(anonymous_namespace)::Nested,bool&>((kj *)local_28,(bool *)((long)&nested.ptr + 7));
  heap<kj::(anonymous_namespace)::Nested,bool&>((kj *)&local_38,(bool *)((long)&nested.ptr + 6));
  pNVar2 = Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t>::operator->
                     ((Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t> *)local_28);
  Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t>::operator=(&pNVar2->nested,&local_38);
  Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t>::~Own(&local_38);
  local_71 = 1;
  if ((nested.ptr._7_1_ & 1) == 0) {
    local_71 = nested.ptr._6_1_;
  }
  _kjCondition_1.value._2_1_ = ~local_71 & 1;
  _kjCondition_1.value._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (bool *)((long)&_kjCondition_1.value + 2));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&_kjCondition_1.value + 3));
  if (!bVar1) {
    _kjCondition_1.value._1_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)_kjCondition_1.value._1_1_ != false) {
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x41,ERROR,"\"failed: expected \" \"!(destroyed1 || destroyed2)\", _kjCondition",
                 (char (*) [45])"failed: expected !(destroyed1 || destroyed2)",
                 (DebugExpression<bool> *)((long)&_kjCondition_1.value + 3));
      _kjCondition_1.value._1_1_ = false;
    }
  }
  pNVar2 = Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t>::operator->
                     ((Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t> *)local_28);
  other = mv<kj::Own<kj::(anonymous_namespace)::Nested,decltype(nullptr)>>(&pNVar2->nested);
  Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t>::operator=
            ((Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t> *)local_28,other);
  DStack_50 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (bool *)((long)&nested.ptr + 7));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&stack0xffffffffffffffb0)
  ;
  if (!bVar1) {
    local_51 = kj::_::Debug::shouldLog(ERROR);
    while (local_51 != false) {
      kj::_::Debug::log<char_const(&)[28],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x43,ERROR,"\"failed: expected \" \"destroyed1\", _kjCondition",
                 (char (*) [28])"failed: expected destroyed1",&stack0xffffffffffffffb0);
      local_51 = false;
    }
  }
  local_53 = (bool)(~nested.ptr._6_1_ & 1);
  local_52 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_53);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_52);
  if (!bVar1) {
    local_54 = kj::_::Debug::shouldLog(ERROR);
    while (local_54 != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x44,ERROR,"\"failed: expected \" \"!(destroyed2)\", _kjCondition",
                 (char (*) [31])"failed: expected !(destroyed2)",&local_52);
      local_54 = false;
    }
  }
  Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t>::operator=
            ((Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t> *)local_28,(void *)0x0);
  DStack_60 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (bool *)((long)&nested.ptr + 7));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&stack0xffffffffffffffa0)
  ;
  local_9a = 0;
  if (bVar1) {
    local_9a = nested.ptr._6_1_;
  }
  local_55 = (bool)(local_9a & 1);
  if (local_55 == false) {
    local_61 = kj::_::Debug::shouldLog(ERROR);
    while (local_61 != false) {
      kj::_::Debug::log<char_const(&)[42],bool&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x46,ERROR,"\"failed: expected \" \"destroyed1 && destroyed2\", _kjCondition",
                 (char (*) [42])"failed: expected destroyed1 && destroyed2",&local_55);
      local_61 = false;
    }
  }
  Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::Nested,_std::nullptr_t> *)local_28);
  return;
}

Assistant:

TEST(Memory, AssignNested) {
  bool destroyed1 = false, destroyed2 = false;
  auto nested = heap<Nested>(destroyed1);
  nested->nested = heap<Nested>(destroyed2);
  EXPECT_FALSE(destroyed1 || destroyed2);
  nested = kj::mv(nested->nested);
  EXPECT_TRUE(destroyed1);
  EXPECT_FALSE(destroyed2);
  nested = nullptr;
  EXPECT_TRUE(destroyed1 && destroyed2);
}